

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O2

void __thiscall
glcts::TextureBufferActiveUniformValidation::deinit(TextureBufferActiveUniformValidation *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  (**(code **)(lVar2 + 0x40))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  iVar1 = 0x84c0;
  while( true ) {
    lVar3 = (long)(this->m_texture_params).
                  super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_texture_params).
                  super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(lVar3 / 0x30) <= (ulong)(iVar1 - 0x84c0)) break;
    (**(code **)(lVar2 + 8))(iVar1);
    (**(code **)(lVar2 + 0xb8))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
    iVar1 = iVar1 + 1;
  }
  (**(code **)(lVar2 + 8))(0x84c0,(ulong)(iVar1 - 0x84c0),lVar3 % 0x30);
  if (this->m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_tbo_tex_ids != (GLuint *)0x0) {
    lVar3 = (long)(this->m_texture_params).
                  super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_texture_params).
                  super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar2 + 0x480))(lVar3 / 0x30 & 0xffffffff,this->m_tbo_tex_ids,lVar3 % 0x30);
    if (this->m_tbo_tex_ids != (GLuint *)0x0) {
      operator_delete__(this->m_tbo_tex_ids);
    }
    this->m_tbo_tex_ids = (GLuint *)0x0;
  }
  if (this->m_tbo_ids != (GLuint *)0x0) {
    lVar3 = (long)(this->m_texture_params).
                  super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_texture_params).
                  super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar2 + 0x438))(lVar3 / 0x30 & 0xffffffff,this->m_tbo_ids,lVar3 % 0x30);
    if (this->m_tbo_ids != (GLuint *)0x0) {
      operator_delete__(this->m_tbo_ids);
    }
    this->m_tbo_ids = (GLuint *)0x0;
  }
  std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::clear
            (&this->m_texture_params);
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureBufferActiveUniformValidation::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, 0);

	for (glw::GLuint i = 0; i < m_texture_params.size(); ++i)
	{
		gl.activeTexture(GL_TEXTURE0 + i);
		gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, 0);
	}
	gl.activeTexture(GL_TEXTURE0);

	/* Delete GLES objects */
	if (0 != m_po_id)
	{
		gl.deleteProgram(m_po_id);
		m_po_id = 0;
	}

	if (0 != m_tbo_tex_ids)
	{
		gl.deleteTextures((glw::GLsizei)m_texture_params.size(), m_tbo_tex_ids);
		delete[] m_tbo_tex_ids;
		m_tbo_tex_ids = 0;
	}

	if (0 != m_tbo_ids)
	{
		gl.deleteBuffers((glw::GLsizei)m_texture_params.size(), m_tbo_ids);
		delete[] m_tbo_ids;
		m_tbo_ids = 0;
	}

	m_texture_params.clear();

	/* Call base class' deinit() */
	TestCaseBase::deinit();
}